

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O0

Res_Win_t * Res_WinAlloc(void)

{
  Res_Win_t *__s;
  Vec_Ptr_t *pVVar1;
  Vec_Vec_t *pVVar2;
  Res_Win_t *p;
  
  __s = (Res_Win_t *)malloc(0x58);
  memset(__s,0,0x58);
  __s->nFanoutLimit = 10;
  __s->nLevTfiMinus = 3;
  pVVar1 = Vec_PtrAlloc(0x100);
  __s->vRoots = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x100);
  __s->vLeaves = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x100);
  __s->vBranches = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x100);
  __s->vNodes = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x100);
  __s->vDivs = pVVar1;
  pVVar2 = Vec_VecStart(0x80);
  __s->vMatrix = pVVar2;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the window.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Res_Win_t * Res_WinAlloc()
{
    Res_Win_t * p;
    // start the manager
    p = ABC_ALLOC( Res_Win_t, 1 );
    memset( p, 0, sizeof(Res_Win_t) );
    // set internal parameters
    p->nFanoutLimit = 10;
    p->nLevTfiMinus =  3;
    // allocate storage
    p->vRoots    = Vec_PtrAlloc( 256 );
    p->vLeaves   = Vec_PtrAlloc( 256 );
    p->vBranches = Vec_PtrAlloc( 256 );
    p->vNodes    = Vec_PtrAlloc( 256 );
    p->vDivs     = Vec_PtrAlloc( 256 );
    p->vMatrix   = Vec_VecStart( 128 );
    return p;
}